

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfRgbaFile.cpp
# Opt level: O2

void __thiscall Imf_3_4::RgbaInputFile::FromYca::readPixels(FromYca *this,int scanLine)

{
  ostream *poVar1;
  char *pcVar2;
  ArgExc *this_00;
  int i;
  Rgba *pRVar3;
  Rgba *pRVar4;
  uint d;
  Rgba **ppRVar5;
  uint uVar6;
  undefined8 *puVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  int iVar11;
  stringstream _iex_throw_s;
  ostream local_1a8 [376];
  
  if (this->_fbBase != (Rgba *)0x0) {
    d = scanLine - this->_currentScanLine;
    uVar6 = -d;
    uVar8 = d;
    if ((int)d < 1) {
      uVar8 = uVar6;
    }
    if (uVar8 < 0x1d) {
      rotateBuf1(this,d);
      if (uVar8 < 3) {
        rotateBuf2(this,d);
      }
    }
    if ((int)d < 0) {
      ppRVar5 = this->_buf1;
      uVar9 = 0x1d;
      if (uVar6 < 0x1d) {
        uVar9 = (ulong)uVar6;
      }
      for (; 0 < (long)uVar9; uVar9 = uVar9 - 1) {
        readYCAScanLine(this,(int)uVar9 + scanLine + -0xf,this->_buf1[uVar9 - 1]);
      }
      uVar8 = 3;
      if ((int)uVar6 < 3) {
        uVar8 = uVar6;
      }
      uVar9 = 0;
      if ((int)uVar8 < 1) {
        uVar8 = 0;
      }
      for (; uVar8 != uVar9; uVar9 = uVar9 + 1) {
        iVar11 = this->_width;
        if ((scanLine + (int)uVar9 & 1U) == 0) {
          RgbaYca::reconstructChromaVert(iVar11,ppRVar5,this->_buf2[uVar9]);
          iVar11 = this->_width;
          pRVar3 = this->_buf2[uVar9];
          pRVar4 = pRVar3;
        }
        else {
          pRVar4 = this->_buf1[uVar9 + 0xd];
          pRVar3 = this->_buf2[uVar9];
        }
        RgbaYca::YCAtoRGBA(&this->_yw,iVar11,pRVar4,pRVar3);
        ppRVar5 = ppRVar5 + 1;
      }
    }
    else {
      uVar9 = 0x1d;
      if (d < 0x1d) {
        uVar9 = (ulong)d;
      }
      iVar11 = (scanLine - (int)uVar9) + 0xf;
      puVar7 = (undefined8 *)((long)this + (0x150 - (ulong)(uint)((int)uVar9 << 3)));
      for (; 0 < (long)uVar9; uVar9 = uVar9 - 1) {
        readYCAScanLine(this,iVar11,(Rgba *)*puVar7);
        iVar11 = iVar11 + 1;
        puVar7 = puVar7 + 1;
      }
      uVar8 = 3;
      if ((int)d < 3) {
        uVar8 = d;
      }
      ppRVar5 = this->_buf2 + 2;
      for (lVar10 = 2; (int)(2 - uVar8) < lVar10; lVar10 = lVar10 + -1) {
        iVar11 = this->_width;
        if (((int)lVar10 + scanLine & 1U) == 0) {
          RgbaYca::reconstructChromaVert(iVar11,ppRVar5 + -0x1d,*ppRVar5);
          iVar11 = this->_width;
          pRVar3 = *ppRVar5;
          pRVar4 = pRVar3;
        }
        else {
          pRVar4 = ppRVar5[-0x10];
          pRVar3 = *ppRVar5;
        }
        RgbaYca::YCAtoRGBA(&this->_yw,iVar11,pRVar4,pRVar3);
        ppRVar5 = ppRVar5 + -1;
      }
    }
    RgbaYca::fixSaturation(&this->_yw,this->_width,this->_buf2,this->_tmpBuf);
    pRVar3 = this->_fbBase;
    for (lVar10 = 0; lVar10 < this->_width; lVar10 = lVar10 + 1) {
      pRVar3[(this->_xMin + lVar10) * this->_fbXStride + this->_fbYStride * (long)scanLine] =
           this->_tmpBuf[lVar10];
    }
    this->_currentScanLine = scanLine;
    return;
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
  poVar1 = std::operator<<(local_1a8,
                           "No frame buffer was specified as the pixel data destination for image file \""
                          );
  pcVar2 = InputPart::fileName(this->_inputPart);
  poVar1 = std::operator<<(poVar1,pcVar2);
  std::operator<<(poVar1,"\".");
  this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_3_4::ArgExc::ArgExc(this_00,(stringstream *)&_iex_throw_s);
  __cxa_throw(this_00,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
}

Assistant:

void
RgbaInputFile::FromYca::readPixels (int scanLine)
{
    if (_fbBase == 0)
    {
        THROW (
            IEX_NAMESPACE::ArgExc,
            "No frame buffer was specified as the "
            "pixel data destination for image file "
            "\"" << _inputPart.fileName ()
                 << "\".");
    }

    //
    // In order to convert one scan line to RGB format, we need that
    // scan line plus N2+1 extra scan lines above and N2+1 scan lines
    // below in luminance/chroma format.
    //
    // We allow random access to scan lines, but we buffer partially
    // processed luminance/chroma data in order to make reading pixels
    // in increasing y or decreasing y order reasonably efficient:
    //
    //	_currentScanLine	holds the y coordinate of the scan line
    //				that was most recently read.
    //
    //	_buf1			contains scan lines _currentScanLine-N2-1
    //				through _currentScanLine+N2+1 in
    //				luminance/chroma format.  Odd-numbered
    //				lines contain no chroma data.  Even-numbered
    //				lines have valid chroma data for all pixels.
    //
    //  _buf2			contains scan lines _currentScanLine-1
    //  			through _currentScanLine+1, in RGB format.
    //				Super-saturated pixels (see ImfRgbaYca.h)
    //				have not yet been eliminated.
    //
    // If the scan line we are trying to read now is close enough to
    // _currentScanLine, we don't have to recompute the contents of _buf1
    // and _buf2 from scratch.  We can rotate _buf1 and _buf2, and fill
    // in the missing data.
    //

    int dy = scanLine - _currentScanLine;

    if (abs (dy) < N + 2) rotateBuf1 (dy);

    if (abs (dy) < 3) rotateBuf2 (dy);

    if (dy < 0)
    {
        {
            int n    = min (-dy, N + 2);
            int yMin = scanLine - N2 - 1;

            for (int i = n - 1; i >= 0; --i)
                readYCAScanLine (yMin + i, _buf1[i]);
        }

        {
            int n = min (-dy, 3);

            for (int i = 0; i < n; ++i)
            {
                if ((scanLine + i) & 1)
                {
                    YCAtoRGBA (_yw, _width, _buf1[N2 + i], _buf2[i]);
                }
                else
                {
                    reconstructChromaVert (_width, _buf1 + i, _buf2[i]);
                    YCAtoRGBA (_yw, _width, _buf2[i], _buf2[i]);
                }
            }
        }
    }
    else
    {
        {
            int n    = min (dy, N + 2);
            int yMax = scanLine + N2 + 1;

            for (int i = n - 1; i >= 0; --i)
                readYCAScanLine (yMax - i, _buf1[N + 1 - i]);
        }

        {
            int n = min (dy, 3);

            for (int i = 2; i > 2 - n; --i)
            {
                if ((scanLine + i) & 1)
                {
                    YCAtoRGBA (_yw, _width, _buf1[N2 + i], _buf2[i]);
                }
                else
                {
                    reconstructChromaVert (_width, _buf1 + i, _buf2[i]);
                    YCAtoRGBA (_yw, _width, _buf2[i], _buf2[i]);
                }
            }
        }
    }

    fixSaturation (_yw, _width, _buf2, _tmpBuf);

    intptr_t base = reinterpret_cast<intptr_t> (_fbBase);
    for (int i = 0; i < _width; ++i)
    {
        Rgba* ptr = reinterpret_cast<Rgba*> (
            base +
            sizeof (Rgba) * (_fbYStride * scanLine + _fbXStride * (i + _xMin)));
        *ptr = _tmpBuf[i];
    }
    _currentScanLine = scanLine;
}